

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5Porter_Ostar(char *zStem,int nStem)

{
  int iVar1;
  uint local_28;
  uint local_24;
  int bCons;
  int mask;
  int i;
  int nStem_local;
  char *zStem_local;
  
  if (((zStem[nStem + -1] == 'w') || (zStem[nStem + -1] == 'x')) || (zStem[nStem + -1] == 'y')) {
    zStem_local._4_4_ = 0;
  }
  else {
    local_24 = 0;
    local_28 = 0;
    for (bCons = 0; bCons < nStem; bCons = bCons + 1) {
      iVar1 = fts5PorterIsVowel(zStem[bCons],local_28);
      local_28 = (uint)((iVar1 != 0 ^ 0xffU) & 1);
      local_24 = local_24 * 2 + local_28;
    }
    zStem_local._4_4_ = (uint)((local_24 & 7) == 5);
  }
  return zStem_local._4_4_;
}

Assistant:

static int fts5Porter_Ostar(char *zStem, int nStem){
  if( zStem[nStem-1]=='w' || zStem[nStem-1]=='x' || zStem[nStem-1]=='y' ){
    return 0;
  }else{
    int i;
    int mask = 0;
    int bCons = 0;
    for(i=0; i<nStem; i++){
      bCons = !fts5PorterIsVowel(zStem[i], bCons);
      assert( bCons==0 || bCons==1 );
      mask = (mask << 1) + bCons;
    }
    return ((mask & 0x0007)==0x0005);
  }
}